

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O3

void __thiscall QThreadPoolPrivate::reset(QThreadPoolPrivate *this)

{
  __pointer_type copy;
  QThread *this_00;
  ulong uVar1;
  bool bVar2;
  QMutex *this_01;
  ulong uVar3;
  QHash<QThreadPoolThread_*,_QHashDummyValue> QVar4;
  long in_FS_OFFSET;
  QSet<QThreadPoolThread_*> __old_val;
  QHash<QThreadPoolThread_*,_QHashDummyValue> local_50;
  QHash<QThreadPoolThread_*,_QHashDummyValue> local_48;
  QHash<QThreadPoolThread_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (this->allThreads).q_hash.d;
  local_50.d = (Data *)0x0;
  (this->allThreads).q_hash.d = (Data *)0x0;
  local_40.d = (Data *)0x0;
  QHash<QThreadPoolThread_*,_QHashDummyValue>::~QHash(&local_40);
  QHash<QThreadPoolThread_*,_QHashDummyValue>::~QHash(&local_50);
  QList<QThreadPoolThread_*>::clear(&(this->expiredThreads).super_QList<QThreadPoolThread_*>);
  QList<QThreadPoolThread_*>::clear(&(this->waitingThreads).super_QList<QThreadPoolThread_*>);
  LOCK();
  copy = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  this_01 = &this->mutex;
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_01->super_QBasicMutex,copy);
  }
  if (local_48.d == (Data *)0x0) {
    uVar3 = 0;
    QVar4.d = (Data *)0x0;
LAB_003c798e:
    if (uVar3 != 0 || QVar4.d != (Data *)0x0) goto LAB_003c79ae;
  }
  else {
    QVar4.d = local_48.d;
    if ((local_48.d)->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if ((local_48.d)->numBuckets == uVar3) {
          uVar3 = 0;
          QVar4.d = (Data *)0x0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while ((local_48.d)->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_003c798e;
    }
    uVar3 = 0;
LAB_003c79ae:
    do {
      this_00 = *(QThread **)
                 (QVar4.d)->spans[uVar3 >> 7].entries
                 [(QVar4.d)->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data;
      bVar2 = QThread::isRunning(this_00);
      if (bVar2) {
        QWaitCondition::wakeAll((QWaitCondition *)(this_00 + 1));
        QThread::wait(this_00,(void *)0x7fffffffffffffff);
      }
      (*(this_00->super_QObject)._vptr_QObject[4])(this_00);
      do {
        if ((QVar4.d)->numBuckets - 1 == uVar3) {
          uVar3 = 0;
          QVar4.d = (Data *)0x0;
          break;
        }
        uVar3 = uVar3 + 1;
      } while ((QVar4.d)->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    } while ((uVar3 != 0) || (QVar4.d != (Data *)0x0));
  }
  if ((this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar2 = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar2) goto LAB_003c7a6c;
  }
  QBasicMutex::lockInternal(&this_01->super_QBasicMutex);
LAB_003c7a6c:
  QHash<QThreadPoolThread_*,_QHashDummyValue>::~QHash(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThreadPoolPrivate::reset()
{
    // move the contents of the set out so that we can iterate without the lock
    auto allThreadsCopy = std::exchange(allThreads, {});
    expiredThreads.clear();
    waitingThreads.clear();

    mutex.unlock();

    for (QThreadPoolThread *thread : std::as_const(allThreadsCopy)) {
        if (thread->isRunning()) {
            thread->runnableReady.wakeAll();
            thread->wait();
        }
        delete thread;
    }

    mutex.lock();
}